

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O1

void __thiscall
vkt::drawutil::VulkanDrawContext::VulkanDrawContext
          (VulkanDrawContext *this,Context *context,DrawState *drawState,DrawCallData *drawCallData,
          VulkanProgram *vulkanProgram)

{
  MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *pMVar1;
  MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this_00;
  Move<vk::Handle<(vk::HandleType)13>_> *__s;
  Move<vk::VkCommandBuffer_s_*> *pMVar2;
  MovePtr<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *this_01;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar3;
  VkCommandPool obj;
  VkCommandBuffer_s *pVVar4;
  DeviceInterface *pDVar5;
  undefined8 uVar6;
  VkImageView obj_00;
  Allocation *pAVar7;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar8;
  VkPipelineLayout obj_01;
  VkRenderPass obj_02;
  deUint64 dVar9;
  VkFramebuffer obj_03;
  VkShaderModule obj_04;
  VkPipeline obj_05;
  VkFormat VVar10;
  bool bVar11;
  undefined2 uVar12;
  float fVar13;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar14;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar15;
  void *pvVar16;
  VkVertexInputBindingDescription *pVVar17;
  int i;
  int iVar18;
  VkResult VVar19;
  long lVar20;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  ImageWithMemory *this_02;
  TextureFormat format;
  BufferWithMemory *pBVar21;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *pvVar22;
  VkPipelineTessellationStateCreateInfo *pVVar23;
  ulong uVar24;
  size_t __n;
  uint uVar25;
  VkAttachmentDescription colorAttachmentDescription;
  undefined4 uStack_364;
  VkBufferCreateInfo bufferCreateInfo;
  VkBufferCreateInfo bufferCreateInfo_1;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStages;
  Move<vk::Handle<(vk::HandleType)14>_> local_208;
  MovePtr<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *local_1e0;
  Move<vk::Handle<(vk::HandleType)18>_> *local_1d8;
  Move<vk::Handle<(vk::HandleType)24>_> *local_1d0;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  Move<vk::Handle<(vk::HandleType)18>_> local_198;
  Move<vk::Handle<(vk::HandleType)13>_> *local_178;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkImageView attachmentBindInfos [1];
  VkAttachmentReference colorAttachmentReference;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkAttachmentReference depthAttachmentReference;
  VkVertexInputBindingDescription bindingDesc;
  VkVertexInputAttributeDescription attributeDesc;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  
  (this->super_DrawContext)._vptr_DrawContext = (_func_int **)&PTR__DrawContext_00d1b990;
  VVar10 = drawState->colorFormat;
  (this->super_DrawContext).m_drawState.topology = drawState->topology;
  (this->super_DrawContext).m_drawState.colorFormat = VVar10;
  lVar20 = 0;
  do {
    (this->super_DrawContext).m_drawState.renderSize.m_data[lVar20] =
         (drawState->renderSize).m_data[lVar20];
    lVar20 = lVar20 + 1;
  } while (lVar20 == 1);
  (this->super_DrawContext).m_drawState.numPatchControlPoints = drawState->numPatchControlPoints;
  bVar11 = drawState->blendEnable;
  uVar12 = *(undefined2 *)&drawState->field_0x12;
  fVar13 = drawState->lineWidth;
  (this->super_DrawContext).m_drawState.depthClampEnable = drawState->depthClampEnable;
  (this->super_DrawContext).m_drawState.blendEnable = bVar11;
  *(undefined2 *)&(this->super_DrawContext).m_drawState.field_0x12 = uVar12;
  (this->super_DrawContext).m_drawState.lineWidth = fVar13;
  (this->super_DrawContext).m_drawCallData.vertices = drawCallData->vertices;
  (this->super_DrawContext)._vptr_DrawContext = (_func_int **)&PTR__VulkanDrawContext_00d1b920;
  this->m_context = context;
  (this->m_program).shaders = vulkanProgram->shaders;
  pMVar1 = &this->m_colorImage;
  (this->m_colorImage).
  super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.m_data.ptr =
       (ImageWithMemory *)0x0;
  this_00 = &this->m_colorAttachmentBuffer;
  (this->m_colorAttachmentBuffer).
  super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.m_data.ptr =
       (BufferWithMemory *)0x0;
  __s = &this->m_colorImageView;
  local_1d0 = &this->m_cmdPool;
  pMVar2 = &this->m_cmdBuffer;
  memset(__s,0,0x180);
  this_01 = &this->m_vertexBuffer;
  (this->m_vertexBuffer).
  super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.m_data.ptr =
       (BufferWithMemory *)0x0;
  local_1e0 = pMVar1;
  local_1d8 = &this->m_pipeline;
  local_178 = __s;
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  pMVar15 = local_1d0;
  allocator = Context::getDefaultAllocator(this->m_context);
  bufferCreateInfo_1._20_4_ = Context::getUniversalQueueFamilyIndex(this->m_context);
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,
             (VkCommandPoolCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  obj.m_internal =
       (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,obj)
    ;
  }
  (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo_1._16_8_;
  (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
  (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       bufferCreateInfo_1._0_8_;
  (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo_1.pNext;
  if (bufferCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo.pNext,
               (VkCommandPool)bufferCreateInfo._0_8_);
  }
  bufferCreateInfo_1._16_8_ =
       (pMVar15->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.size._0_4_ = 0;
  bufferCreateInfo_1.size._4_4_ = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
             (VkCommandBufferAllocateInfo *)&bufferCreateInfo_1);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (undefined4)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = bufferCreateInfo.size._4_4_;
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  pVVar4 = (pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
  if (pVVar4 != (VkCommandBuffer_s *)0x0) {
    pDVar5 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    colorAttachmentDescription._0_8_ = pVVar4;
    (*pDVar5->_vptr_DeviceInterface[0x48])
              (pDVar5,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
  }
  *(VkBufferCreateFlags *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       bufferCreateInfo_1.flags;
  *(undefined4 *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4) =
       bufferCreateInfo_1._20_4_;
  *(VkFormat *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (VkFormat)bufferCreateInfo_1.size;
  *(undefined4 *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
           m_internal + 4) = bufferCreateInfo_1.size._4_4_;
  *(VkStructureType *)&(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
       bufferCreateInfo_1.sType;
  *(undefined4 *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
       bufferCreateInfo_1._4_4_;
  *(undefined4 *)
   &(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       bufferCreateInfo_1.pNext._0_4_;
  *(undefined4 *)
   ((long)&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface +
   4) = bufferCreateInfo_1.pNext._4_4_;
  if (bufferCreateInfo._0_8_ != 0) {
    bufferCreateInfo_1.sType = bufferCreateInfo.sType;
    bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
    (**(code **)(*bufferCreateInfo.pNext + 0x240))
              (bufferCreateInfo.pNext,bufferCreateInfo._16_8_,bufferCreateInfo.size,1);
  }
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0;
  bufferCreateInfo_1._20_4_ = 1;
  bufferCreateInfo_1.size._0_4_ = (this->super_DrawContext).m_drawState.colorFormat;
  uVar6 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.size._4_4_ = (undefined4)uVar6;
  bufferCreateInfo_1.usage = (VkBufferUsageFlags)((ulong)uVar6 >> 0x20);
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_CONCURRENT;
  bufferCreateInfo_1.queueFamilyIndexCount = 1;
  bufferCreateInfo_1._44_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  this_02 = (ImageWithMemory *)operator_new(0x30);
  ::vk::ImageWithMemory::ImageWithMemory
            (this_02,vk,device,allocator,(VkImageCreateInfo *)&bufferCreateInfo_1,
             (MemoryRequirement)0x0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  if ((pMVar1->super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>).
      m_data.ptr != this_02) {
    de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::reset
              (&pMVar1->
                super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>);
    (pMVar1->super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>).m_data
    .ptr = this_02;
  }
  de::details::UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>::reset
            ((UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_> *)
             &bufferCreateInfo);
  bufferCreateInfo.size =
       (((this->m_colorImage).
         super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.m_data.ptr)
       ->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
  bufferCreateInfo.sharingMode = (this->super_DrawContext).m_drawState.colorFormat;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo.queueFamilyIndexCount = 3;
  bufferCreateInfo._44_4_ = 4;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x600000005;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentDescription,vk,device,
             (VkImageViewCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo.flags = colorAttachmentDescription.storeOp;
  bufferCreateInfo._20_4_ = colorAttachmentDescription.stencilLoadOp;
  bufferCreateInfo.size._0_4_ = colorAttachmentDescription.stencilStoreOp;
  bufferCreateInfo.size._4_4_ = colorAttachmentDescription.initialLayout;
  bufferCreateInfo.sType = colorAttachmentDescription.flags;
  bufferCreateInfo._4_4_ = colorAttachmentDescription.format;
  bufferCreateInfo.pNext = (void *)colorAttachmentDescription._8_8_;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  obj_00.m_internal = (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal
  ;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_00);
  }
  (this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  (this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)bufferCreateInfo.size;
  (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  (this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  if (colorAttachmentDescription._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentDescription.samples,
               (VkImageView)colorAttachmentDescription._0_8_);
  }
  format = ::vk::mapVkFormat((this->super_DrawContext).m_drawState.colorFormat);
  iVar18 = tcu::getPixelSize(format);
  uVar24 = (ulong)(iVar18 * (this->super_DrawContext).m_drawState.renderSize.m_data[0] *
                  (this->super_DrawContext).m_drawState.renderSize.m_data[1]);
  pBVar21 = (BufferWithMemory *)operator_new(0x30);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
  bufferCreateInfo.usage = 2;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo._40_8_ = bufferCreateInfo._40_8_ & 0xffffffff00000000;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferCreateInfo.size = uVar24;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar21,vk,device,allocator,&bufferCreateInfo,(MemoryRequirement)0x1);
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  if ((this_00->super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
      m_data.ptr != pBVar21) {
    de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
              (&this_00->
                super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>);
    (this_00->super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
    m_data.ptr = pBVar21;
  }
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
            ((UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)
             &colorAttachmentDescription);
  pAVar7 = (((this_00->
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar7->m_hostPtr,0,uVar24);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,uVar24);
  pvVar8 = (this->super_DrawContext).m_drawCallData.vertices;
  __n = (long)(pvVar8->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar8->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  pBVar21 = (BufferWithMemory *)operator_new(0x30);
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ = bufferCreateInfo_1._16_8_ & 0xffffffff00000000;
  bufferCreateInfo_1.usage = 0x80;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo_1.size = __n;
  ::vk::BufferWithMemory::BufferWithMemory
            (pBVar21,vk,device,allocator,&bufferCreateInfo_1,(MemoryRequirement)0x1);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  if ((this_01->super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
      m_data.ptr != pBVar21) {
    de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
              (&this_01->
                super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>);
    (this_01->super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
    m_data.ptr = pBVar21;
  }
  de::details::UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>::reset
            ((UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_> *)
             &bufferCreateInfo);
  pAVar7 = (((this->m_vertexBuffer).
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy(pAVar7->m_hostPtr,
         (((this->super_DrawContext).m_drawCallData.vertices)->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar7->m_memory).m_internal,pAVar7->m_offset,__n);
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.usage = 0;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = 0;
  bufferCreateInfo_1.flags = 0;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 0;
  bufferCreateInfo_1.size._4_4_ = 0;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device,
             (VkPipelineLayoutCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo_1.flags = bufferCreateInfo.flags;
  bufferCreateInfo_1._20_4_ = bufferCreateInfo._20_4_;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)bufferCreateInfo.size;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  bufferCreateInfo_1.sType = bufferCreateInfo.sType;
  bufferCreateInfo_1._4_4_ = bufferCreateInfo._4_4_;
  bufferCreateInfo_1.pNext = bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  obj_01.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_01);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo_1._16_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       bufferCreateInfo_1._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)bufferCreateInfo_1.pNext;
  if (bufferCreateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo.pNext,
               (VkPipelineLayout)bufferCreateInfo._0_8_);
  }
  colorAttachmentDescription._0_8_ =
       (ulong)(this->super_DrawContext).m_drawState.colorFormat << 0x20;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  stack0xfffffffffffffc98 = CONCAT44(uStack_364,2);
  bufferCreateInfo_1._32_8_ = &colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  bufferCreateInfo_1.pQueueFamilyIndices = &depthAttachmentReference.attachment;
  depthAttachmentReference.attachment = 0xffffffff;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext = (void *)((ulong)bufferCreateInfo_1.pNext & 0xffffffff00000000);
  bufferCreateInfo_1.flags = 0;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 1;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 1;
  bufferCreateInfo.size = (VkDeviceSize)&colorAttachmentDescription;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices & 0xffffffff00000000);
  bufferCreateInfo._40_8_ = &bufferCreateInfo_1;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexInputStateInfo,vk,device,
             (VkRenderPassCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar17 = vertexInputStateInfo.pVertexBindingDescriptions;
  uVar6 = vertexInputStateInfo._16_8_;
  pvVar16 = vertexInputStateInfo.pNext;
  attachmentBindInfos[0].m_internal = (VkImageView)(VkImageView)vertexInputStateInfo._0_8_;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 0;
  vertexInputStateInfo.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  obj_02.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_02);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)uVar6;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar17;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)attachmentBindInfos[0].m_internal;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pvVar16;
  if (vertexInputStateInfo._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)&vertexInputStateInfo.pNext,
               (VkRenderPass)vertexInputStateInfo._0_8_);
  }
  attachmentBindInfos[0].m_internal =
       (VkImageView)
       (this->m_colorImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  bufferCreateInfo_1._40_8_ = attachmentBindInfos;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ = bufferCreateInfo_1._16_8_ & 0xffffffff00000000;
  dVar9 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
          m_internal;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar9;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar9 >> 0x20);
  bufferCreateInfo_1.usage = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ =
       (this->super_DrawContext).m_drawState.renderSize.m_data[0];
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ =
       (this->super_DrawContext).m_drawState.renderSize.m_data[1];
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription,vk,device,
             (VkFramebufferCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo.flags = colorAttachmentDescription.storeOp;
  bufferCreateInfo._20_4_ = colorAttachmentDescription.stencilLoadOp;
  bufferCreateInfo.size._0_4_ = colorAttachmentDescription.stencilStoreOp;
  bufferCreateInfo.size._4_4_ = colorAttachmentDescription.initialLayout;
  bufferCreateInfo.sType = colorAttachmentDescription.flags;
  bufferCreateInfo._4_4_ = colorAttachmentDescription.format;
  bufferCreateInfo.pNext = (void *)colorAttachmentDescription._8_8_;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  obj_03.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_03);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)bufferCreateInfo.pNext;
  if (colorAttachmentDescription._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription.samples,
               (VkFramebuffer)colorAttachmentDescription._0_8_);
  }
  vertexInputStateInfo.pVertexBindingDescriptions = &bindingDesc;
  bindingDesc.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  bindingDesc.binding = 0;
  bindingDesc.stride = 0x10;
  vertexInputStateInfo.pVertexAttributeDescriptions = &attributeDesc;
  attributeDesc.location = 0;
  attributeDesc.binding = 0;
  attributeDesc.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  attributeDesc.offset = 0;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.vertexBindingDescriptionCount = 1;
  uVar25 = 1;
  vertexInputStateInfo.vertexAttributeDescriptionCount = 1;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ =
       (ulong)(this->super_DrawContext).m_drawState.topology << 0x20;
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  pipelineTessellationStateInfo.pNext = (void *)0x0;
  pipelineTessellationStateInfo.flags = 0;
  pipelineTessellationStateInfo.patchControlPoints =
       (this->super_DrawContext).m_drawState.numPatchControlPoints;
  colorAttachmentReference.attachment = 0x16;
  colorAttachmentDescription.flags = 0x17;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription._16_8_ =
       (ulong)(this->super_DrawContext).m_drawState.depthClampEnable << 0x20;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  stack0xfffffffffffffc98 = 0;
  depthAttachmentReference.attachment = 0x18;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0x100000000;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  attachmentBindInfos[0].m_internal._0_4_ = 0x1a;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderStages.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar22 = (this->m_program).shaders;
  if ((pvVar22->super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (pvVar22->super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar24 = 0;
    do {
      ::vk::createShaderModule
                (&local_208,vk,device,
                 (pvVar22->
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar24].binary,0);
      bufferCreateInfo_1._16_8_ =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
      bufferCreateInfo_1.size._0_4_ =
           (VkFormat)
           local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
      bufferCreateInfo_1.size._4_4_ =
           (undefined4)
           ((ulong)local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                   m_allocator >> 0x20);
      bufferCreateInfo_1._0_8_ =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
      bufferCreateInfo_1.pNext =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      pMVar3 = this->m_shaderModules + uVar24;
      obj_04.m_internal =
           this->m_shaderModules[uVar24].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
           object.m_internal;
      if (obj_04.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter,obj_04);
      }
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
           (VkDevice)bufferCreateInfo_1._16_8_;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo_1.size._4_4_,(VkFormat)bufferCreateInfo_1.size);
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
           bufferCreateInfo_1._0_8_;
      (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)bufferCreateInfo_1.pNext;
      if (local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
                   (VkShaderModule)
                   local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal
                  );
      }
      bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
      bufferCreateInfo_1.pNext = (void *)0x0;
      bufferCreateInfo_1._16_8_ =
           (ulong)(((this->m_program).shaders)->
                  super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>)
                  ._M_impl.super__Vector_impl_data._M_start[uVar24].stage << 0x20;
      dVar9 = (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
      bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar9;
      bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar9 >> 0x20);
      bufferCreateInfo_1.usage = 0xaed455;
      bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      bufferCreateInfo_1.queueFamilyIndexCount = 0;
      bufferCreateInfo_1._44_4_ = 0;
      if (shaderStages.
          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          shaderStages.
          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
        ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
                  ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                    *)&shaderStages,
                   (iterator)
                   shaderStages.
                   super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkPipelineShaderStageCreateInfo *)&bufferCreateInfo_1);
      }
      else {
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pName = "main";
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pSpecializationInfo =
             (VkSpecializationInfo *)0x0;
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->flags = bufferCreateInfo_1.flags;
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->stage = bufferCreateInfo_1._20_4_;
        ((shaderStages.
          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)->module).m_internal = dVar9;
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sType =
             VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        *(undefined4 *)
         &(shaderStages.
           super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = bufferCreateInfo_1._4_4_;
        (shaderStages.
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pNext = (void *)0x0;
        shaderStages.
        super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             shaderStages.
             super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pvVar22 = (this->m_program).shaders;
      uVar24 = (ulong)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar24 < (ulong)((long)(pvVar22->
                                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar22->
                                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ =
       (ulong)(uint)((int)((ulong)((long)shaderStages.
                                         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)shaderStages.
                                        super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555) << 0x20;
  bufferCreateInfo_1.size._0_4_ =
       (VkFormat)
       shaderStages.
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo_1.size._4_4_ =
       (undefined4)
       ((ulong)shaderStages.
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  bufferCreateInfo_1._32_8_ = &vertexInputStateInfo;
  bufferCreateInfo_1._40_8_ = &pipelineInputAssemblyStateInfo;
  pVVar23 = &pipelineTessellationStateInfo;
  if ((this->super_DrawContext).m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) {
    pVVar23 = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = (uint)pVVar23;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = (uint)((ulong)pVVar23 >> 0x20);
  ::vk::createGraphicsPipeline
            (&local_198,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&bufferCreateInfo_1,(VkAllocationCallbacks *)0x0);
  pMVar14 = local_1d8;
  pMVar1 = local_1e0;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_05.m_internal =
       (local_1d8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  if (obj_05.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_05);
  }
  (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  if (local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_198.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (shaderStages.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shaderStages.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)shaderStages.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)shaderStages.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  bufferCreateInfo_1.flags = 1;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 0;
  bufferCreateInfo_1.size._4_4_ = 0;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext = (void *)0x0;
  VVar19 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar19,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktDrawUtil.cpp"
                    ,0xf3);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  uVar6 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1._16_8_ =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  dVar9 = (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
          m_internal;
  bufferCreateInfo_1.size._0_4_ = (VkFormat)dVar9;
  bufferCreateInfo_1.size._4_4_ = (undefined4)(dVar9 >> 0x20);
  bufferCreateInfo_1.usage = 0;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = (deUint32)uVar6;
  bufferCreateInfo_1._44_4_ = SUB84((ulong)uVar6 >> 0x20,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  (*vk->_vptr_DeviceInterface[0x74])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &bufferCreateInfo_1,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,
             (pMVar14->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,1,
             (this_01->
             super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
             m_data.ptr,&colorAttachmentDescription);
  pvVar8 = (this->super_DrawContext).m_drawCallData.vertices;
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)((long)(pvVar8->
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar8->
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])
            (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  uVar6 = (((pMVar1->super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>
            ).m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0x100;
  bufferCreateInfo_1._20_4_ = 0x800;
  bufferCreateInfo_1.size._0_4_ = 2;
  bufferCreateInfo_1.size._4_4_ = 6;
  bufferCreateInfo_1.usage = 0xffffffff;
  bufferCreateInfo_1.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = (deUint32)uVar6;
  bufferCreateInfo_1._44_4_ = SUB84((ulong)uVar6 >> 0x20,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x400,0x1000,0,0,0,0,
             0,1,&bufferCreateInfo_1);
  uVar6 = *(undefined8 *)(this->super_DrawContext).m_drawState.renderSize.m_data;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 1;
  bufferCreateInfo_1._20_4_ = 0;
  bufferCreateInfo_1.size._0_4_ = 0;
  bufferCreateInfo_1.size._4_4_ = 1;
  bufferCreateInfo_1.usage = 0;
  bufferCreateInfo_1.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = SUB84(uVar6,0);
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = (uint)((ulong)uVar6 >> 0x20);
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 1;
  (*vk->_vptr_DeviceInterface[99])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (deUint64)
             (((this->m_colorImage).
               super_UniqueBase<vk::ImageWithMemory,_de::DefaultDeleter<vk::ImageWithMemory>_>.
               m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object,6,
             (deUint64)
             (((this->m_colorAttachmentBuffer).
               super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
               m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object,1,
             &bufferCreateInfo_1);
  uVar6 = (((this_00->
            super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>).
            m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo_1.pNext = (void *)0x0;
  bufferCreateInfo_1.flags = 0x1000;
  bufferCreateInfo_1._20_4_ = 0x2000;
  bufferCreateInfo_1.size._0_4_ = 0xffffffff;
  bufferCreateInfo_1.size._4_4_ = 0xffffffff;
  bufferCreateInfo_1.usage = (VkBufferUsageFlags)uVar6;
  bufferCreateInfo_1.sharingMode = (VkSharingMode)((ulong)uVar6 >> 0x20);
  bufferCreateInfo_1.queueFamilyIndexCount = 0;
  bufferCreateInfo_1._44_4_ = 0;
  bufferCreateInfo_1.pQueueFamilyIndices._0_4_ = 0xffffffff;
  bufferCreateInfo_1.pQueueFamilyIndices._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x4000,0,0,0,1
             ,&bufferCreateInfo_1,0,0);
  VVar19 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(pMVar2->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar19,"vk.endCommandBuffer(commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktDrawUtil.cpp"
                    ,0xf8);
  return;
}

Assistant:

VulkanDrawContext::VulkanDrawContext (  Context&				context,
										const DrawState&		drawState,
										const DrawCallData&		drawCallData,
										const VulkanProgram&	vulkanProgram)
	: DrawContext						(drawState, drawCallData)
	, m_context							(context)
	, m_program							(vulkanProgram)
{
	const DeviceInterface&	vk						= m_context.getDeviceInterface();
	const VkDevice			device					= m_context.getDevice();
	Allocator&				allocator				= m_context.getDefaultAllocator();
	VkImageSubresourceRange	colorSubresourceRange;

	// Command buffer
	{
		m_cmdPool			= makeCommandPool(vk, device, m_context.getUniversalQueueFamilyIndex());
		m_cmdBuffer			= makeCommandBuffer(vk, device, *m_cmdPool);
	}

	// Color attachment image
	{
		const VkImageUsageFlags usage			= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
		colorSubresourceRange					= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageCreateInfo	imageCreateInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,										// VkStructureType			sType;
			DE_NULL,																	// const void*				pNext;
			(VkImageCreateFlags)0,														// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,															// VkImageType				imageType;
			m_drawState.colorFormat,													// VkFormat					format;
			makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u),	// VkExtent3D				extent;
			1u,																			// uint32_t					mipLevels;
			1u,																			// uint32_t					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,														// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,													// VkImageTiling			tiling;
			usage,																		// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,													// VkSharingMode			sharingMode;
			VK_QUEUE_FAMILY_IGNORED,													// uint32_t					queueFamilyIndexCount;
			DE_NULL,																	// const uint32_t*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED,													// VkImageLayout			initialLayout;
		};

		m_colorImage = MovePtr<ImageWithMemory>(new ImageWithMemory(vk, device, allocator, imageCreateInfo, MemoryRequirement::Any));
		m_colorImageView = makeImageView(vk, device, **m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_drawState.colorFormat, colorSubresourceRange);

		// Buffer to copy attachment data after rendering

		const VkDeviceSize bitmapSize = tcu::getPixelSize(mapVkFormat(m_drawState.colorFormat)) * m_drawState.renderSize.x() * m_drawState.renderSize.y();
		m_colorAttachmentBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bitmapSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

		{
			const Allocation& alloc = m_colorAttachmentBuffer->getAllocation();
			deMemset(alloc.getHostPtr(), 0, (size_t)bitmapSize);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bitmapSize);
		}
	}

	// Vertex buffer
	{
		const VkDeviceSize bufferSize = m_drawCallData.vertices.size() * sizeof(m_drawCallData.vertices[0]);
		m_vertexBuffer = MovePtr<BufferWithMemory>(new BufferWithMemory(
			vk, device, allocator, makeBufferCreateInfo(bufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible));

		const Allocation& alloc = m_vertexBuffer->getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_drawCallData.vertices[0], (size_t)bufferSize);
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), bufferSize);
	}

	// Pipeline layout
	{
		m_pipelineLayout = makePipelineLayoutWithoutDescriptors(vk, device);
	}

	// Renderpass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
			m_drawState.colorFormat,							// VkFormat							format;
			VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout					initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			VK_ATTACHMENT_UNUSED,								// deUint32			attachment;
			VK_IMAGE_LAYOUT_UNDEFINED							// VkImageLayout	layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			(VkSubpassDescriptionFlags)0,						// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&colorAttachmentReference,							// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,											// const VkAttachmentReference*		pResolveAttachments;
			&depthAttachmentReference,							// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL												// const deUint32*					pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassInfo =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			(VkRenderPassCreateFlags)0,							// VkRenderPassCreateFlags			flags;
			1u,													// deUint32							attachmentCount;
			&colorAttachmentDescription,						// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDescription,								// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL												// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass = createRenderPass(vk, device, &renderPassInfo);
	}

	// Framebuffer
	{
		const VkImageView attachmentBindInfos[] =
		{
			m_colorImageView.get()
		};

		const VkFramebufferCreateInfo framebufferInfo = {
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,										// const void*							pNext;
			(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags				flags;
			*m_renderPass,									// VkRenderPass							renderPass;
			DE_LENGTH_OF_ARRAY(attachmentBindInfos),		// uint32_t								attachmentCount;
			attachmentBindInfos,							// const VkImageView*					pAttachments;
			m_drawState.renderSize.x(),						// uint32_t								width;
			m_drawState.renderSize.y(),						// uint32_t								height;
			1u,												// uint32_t								layers;
		};

		m_framebuffer = createFramebuffer(vk, device, &framebufferInfo);
	}

	// Graphics pipeline
	{
		const deUint32	vertexStride	= sizeof(Vec4);
		const VkFormat	vertexFormat	= VK_FORMAT_R32G32B32A32_SFLOAT;

		DE_ASSERT(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST || m_drawState.numPatchControlPoints > 0);

		const VkVertexInputBindingDescription bindingDesc =
		{
			0u,									// uint32_t				binding;
			vertexStride,						// uint32_t				stride;
			VK_VERTEX_INPUT_RATE_VERTEX,		// VkVertexInputRate	inputRate;
		};
		const VkVertexInputAttributeDescription attributeDesc =
		{
			0u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			vertexFormat,						// VkFormat			format;
			0u,									// uint32_t			offset;
		};

		const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags		flags;
			1u,																// uint32_t										vertexBindingDescriptionCount;
			&bindingDesc,													// const VkVertexInputBindingDescription*		pVertexBindingDescriptions;
			1u,																// uint32_t										vertexAttributeDescriptionCount;
			&attributeDesc,													// const VkVertexInputAttributeDescription*		pVertexAttributeDescriptions;
		};

		const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags		flags;
			m_drawState.topology,											// VkPrimitiveTopology							topology;
			VK_FALSE,														// VkBool32										primitiveRestartEnable;
		};

		const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType								sType;
			DE_NULL,														// const void*									pNext;
			(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags		flags;
			m_drawState.numPatchControlPoints,								// uint32_t										patchControlPoints;
		};

		const VkViewport viewport = makeViewport(
			0.0f, 0.0f,
			static_cast<float>(m_drawState.renderSize.x()), static_cast<float>(m_drawState.renderSize.y()),
			0.0f, 1.0f);

		const VkRect2D scissor = {
			makeOffset2D(0, 0),
			makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y()),
		};

		const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,												// const void*										pNext;
			(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags				flags;
			1u,														// uint32_t											viewportCount;
			&viewport,												// const VkViewport*								pViewports;
			1u,														// uint32_t											scissorCount;
			&scissor,												// const VkRect2D*									pScissors;
		};

		const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags	flags;
			m_drawState.depthClampEnable,									// VkBool32									depthClampEnable;
			VK_FALSE,														// VkBool32									rasterizerDiscardEnable;
			VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
			VK_CULL_MODE_NONE,												// VkCullModeFlags							cullMode;
			VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
			VK_FALSE,														// VkBool32									depthBiasEnable;
			0.0f,															// float									depthBiasConstantFactor;
			0.0f,															// float									depthBiasClamp;
			0.0f,															// float									depthBiasSlopeFactor;
			m_drawState.lineWidth,											// float									lineWidth;
		};

		const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
			VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
			VK_FALSE,													// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			VK_FALSE,													// VkBool32									alphaToCoverageEnable;
			VK_FALSE													// VkBool32									alphaToOneEnable;
		};

		const VkStencilOpState stencilOpState = makeStencilOpState(
			VK_STENCIL_OP_KEEP,		// stencil fail
			VK_STENCIL_OP_KEEP,		// depth & stencil pass
			VK_STENCIL_OP_KEEP,		// depth only fail
			VK_COMPARE_OP_NEVER,	// compare op
			0u,						// compare mask
			0u,						// write mask
			0u);					// reference

		const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
			VK_FALSE,													// VkBool32									depthTestEnable;
			VK_FALSE,													// VkBool32									depthWriteEnable;
			VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
			VK_FALSE,													// VkBool32									depthBoundsTestEnable;
			VK_FALSE,													// VkBool32									stencilTestEnable;
			stencilOpState,												// VkStencilOpState							front;
			stencilOpState,												// VkStencilOpState							back;
			0.0f,														// float									minDepthBounds;
			1.0f,														// float									maxDepthBounds;
		};

		const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
		const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
		{
			m_drawState.blendEnable,			// VkBool32					blendEnable;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
			VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
			VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
			VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
			colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
		};

		const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
			DE_NULL,													// const void*									pNext;
			(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
			VK_FALSE,													// VkBool32										logicOpEnable;
			VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
			1u,															// deUint32										attachmentCount;
			&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
			{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
		};

		// Create shader stages

		std::vector<VkPipelineShaderStageCreateInfo>	shaderStages;
		VkShaderStageFlags								stageFlags = (VkShaderStageFlags)0;

		DE_ASSERT(m_program.shaders.size() <= MAX_NUM_SHADER_MODULES);
		for (deUint32 shaderNdx = 0; shaderNdx < m_program.shaders.size(); ++shaderNdx)
		{
			m_shaderModules[shaderNdx] = createShaderModule(vk, device, *m_program.shaders[shaderNdx].binary, (VkShaderModuleCreateFlags)0);

			const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
				DE_NULL,												// const void*							pNext;
				(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
				m_program.shaders[shaderNdx].stage,						// VkShaderStageFlagBits				stage;
				*m_shaderModules[shaderNdx],							// VkShaderModule						module;
				"main",													// const char*							pName;
				DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
			};

			shaderStages.push_back(pipelineShaderStageInfo);
			stageFlags |= m_program.shaders[shaderNdx].stage;
		}

		DE_ASSERT(
			(m_drawState.topology != VK_PRIMITIVE_TOPOLOGY_PATCH_LIST) ||
			(stageFlags & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)));

		const bool tessellationEnabled = (m_drawState.topology == VK_PRIMITIVE_TOPOLOGY_PATCH_LIST);
		const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
			DE_NULL,																// const void*										pNext;
			(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
			static_cast<deUint32>(shaderStages.size()),								// deUint32											stageCount;
			&shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			(tessellationEnabled ? &pipelineTessellationStateInfo : DE_NULL),		// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&pipelineViewportStateInfo,												// const VkPipelineViewportStateCreateInfo*			pViewportState;
			&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
			&pipelineMultisampleStateInfo,											// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			&pipelineDepthStencilStateInfo,											// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			&pipelineColorBlendStateInfo,											// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,																// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			*m_pipelineLayout,														// VkPipelineLayout									layout;
			*m_renderPass,															// VkRenderPass										renderPass;
			0u,																		// deUint32											subpass;
			DE_NULL,																// VkPipeline										basePipelineHandle;
			0,																		// deInt32											basePipelineIndex;
		};

		m_pipeline = createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
	}

	// Record commands
	{
		const VkDeviceSize zeroOffset = 0ull;

		beginCommandBuffer(vk, *m_cmdBuffer);

		// Begin render pass
		{
			const VkClearValue	clearValue = makeClearValueColor(Vec4(0.0f, 0.0f, 0.0f, 1.0f));
			const VkRect2D		renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(m_drawState.renderSize.x(), m_drawState.renderSize.y())
			};

			const VkRenderPassBeginInfo renderPassBeginInfo = {
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType								sType;
				DE_NULL,															// const void*									pNext;
				*m_renderPass,														// VkRenderPass									renderPass;
				*m_framebuffer,														// VkFramebuffer								framebuffer;
				renderArea,															// VkRect2D										renderArea;
				1u,																	// uint32_t										clearValueCount;
				&clearValue,														// const VkClearValue*							pClearValues;
			};

			vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
		}

		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &(**m_vertexBuffer), &zeroOffset);

		vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_drawCallData.vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*m_cmdBuffer);

		// Barrier: draw -> copy from image
		{
			const VkImageMemoryBarrier barrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				**m_colorImage, colorSubresourceRange);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u),
					makeExtent3D(m_drawState.renderSize.x(), m_drawState.renderSize.y(), 1u));
			vk.cmdCopyImageToBuffer(*m_cmdBuffer, **m_colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_colorAttachmentBuffer, 1u, &copyRegion);
		}

		// Barrier: copy to buffer -> host read
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
				**m_colorAttachmentBuffer, 0ull, VK_WHOLE_SIZE);

			vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *m_cmdBuffer);
	}
}